

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool rm(upb_table *t,lookupkey_t key,upb_value *val,upb_tabkey *removed,uint32_t hash,
        eqlfunc_t *eql)

{
  upb_tabkey uVar1;
  _upb_tabent *p_Var2;
  upb_tabent *puVar3;
  uint64_t uVar4;
  _Bool _Var5;
  upb_tabent *move;
  _upb_tabent **pp_Var6;
  uint uVar7;
  
  uVar7 = hash & t->mask;
  uVar1 = t->entries[uVar7].key;
  if (uVar1 != 0) {
    puVar3 = t->entries + uVar7;
    _Var5 = (*eql)(uVar1,key);
    if (_Var5) {
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (puVar3->val).val;
      }
      if (removed != (upb_tabkey *)0x0) {
        *removed = puVar3->key;
      }
      p_Var2 = puVar3->next;
      if (p_Var2 == (_upb_tabent *)0x0) {
        puVar3->key = 0;
      }
      else {
        puVar3->next = p_Var2->next;
        uVar4 = (p_Var2->val).val;
        puVar3->key = p_Var2->key;
        (puVar3->val).val = uVar4;
        p_Var2->key = 0;
      }
      return true;
    }
    p_Var2 = puVar3->next;
    while (p_Var2 != (_upb_tabent *)0x0) {
      pp_Var6 = &puVar3->next;
      _Var5 = (*eql)(p_Var2->key,key);
      puVar3 = *pp_Var6;
      if (_Var5) {
        if (puVar3 == (_upb_tabent *)0x0) {
          return false;
        }
        t->count = t->count - 1;
        if (val != (upb_value *)0x0) {
          val->val = (puVar3->val).val;
        }
        if (removed != (upb_tabkey *)0x0) {
          *removed = puVar3->key;
        }
        puVar3->key = 0;
        *pp_Var6 = puVar3->next;
        return true;
      }
      p_Var2 = puVar3->next;
    }
  }
  return false;
}

Assistant:

static bool rm(upb_table* t, lookupkey_t key, upb_value* val,
               upb_tabkey* removed, uint32_t hash, eqlfunc_t* eql) {
  upb_tabent* chain = getentry_mutable(t, hash);
  if (upb_tabent_isempty(chain)) return false;
  if (eql(chain->key, key)) {
    /* Element to remove is at the head of its chain. */
    t->count--;
    if (val) _upb_value_setval(val, chain->val.val);
    if (removed) *removed = chain->key;
    if (chain->next) {
      upb_tabent* move = (upb_tabent*)chain->next;
      *chain = *move;
      move->key = 0; /* Make the slot empty. */
    } else {
      chain->key = 0; /* Make the slot empty. */
    }
    return true;
  } else {
    /* Element to remove is either in a non-head position or not in the
     * table. */
    while (chain->next && !eql(chain->next->key, key)) {
      chain = (upb_tabent*)chain->next;
    }
    if (chain->next) {
      /* Found element to remove. */
      upb_tabent* rm = (upb_tabent*)chain->next;
      t->count--;
      if (val) _upb_value_setval(val, chain->next->val.val);
      if (removed) *removed = rm->key;
      rm->key = 0; /* Make the slot empty. */
      chain->next = rm->next;
      return true;
    } else {
      /* Element to remove is not in the table. */
      return false;
    }
  }
}